

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexical.cc
# Opt level: O2

bool __thiscall lexical::analyse_annotation(lexical *this,iterator *it,Meta *m)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  undefined4 uVar3;
  char *ch;
  Token t;
  string buf;
  undefined1 local_58 [8];
  _Alloc_hider local_50;
  size_type local_48;
  char local_40 [16];
  
  buf._M_dataplus._M_p = (pointer)&buf.field_2;
  buf._M_string_length = 0;
  buf.field_2._M_local_buf[0] = '\0';
  ch = it->_M_current;
  uVar3 = 0;
  do {
    if (ch == (m->end)._M_current) {
LAB_0010c9ad:
      bVar2 = false;
LAB_0010c9af:
      std::__cxx11::string::~string((string *)&buf);
      return bVar2;
    }
    switch(uVar3) {
    case 0:
      uVar3 = 1;
      break;
    case 1:
      bVar2 = sutil::is_key(ch,true);
      if (!bVar2) {
        std::__cxx11::string::string((string *)&t,anon_var_dwarf_2bc06,(allocator *)local_58);
        error(this,it,m,(string *)&t);
        std::__cxx11::string::~string((string *)&t);
        goto LAB_0010c9ad;
      }
      ch = it->_M_current + -1;
      it->_M_current = ch;
      uVar3 = 2;
      break;
    case 2:
      bVar2 = sutil::is_key(ch,false);
      if (bVar2) {
        std::__cxx11::string::push_back((char)&buf);
        ch = it->_M_current;
        uVar3 = 2;
      }
      else {
        ch = it->_M_current + -1;
        it->_M_current = ch;
        uVar3 = 3;
      }
      break;
    case 3:
      Token::Token(&t,m->line,m->column,8,&buf);
      std::vector<Token,_std::allocator<Token>_>::push_back(&this->tokens,&t);
      paVar1 = &t.name.field_2;
      local_50._M_p = local_40;
      local_58._0_4_ = t.type;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)t.name._M_dataplus._M_p == paVar1) {
        local_40[8] = t.name.field_2._8_1_;
        local_40[9] = t.name.field_2._9_1_;
        local_40[10] = t.name.field_2._10_1_;
        local_40[0xb] = t.name.field_2._11_1_;
        local_40[0xc] = t.name.field_2._12_1_;
        local_40[0xd] = t.name.field_2._13_1_;
        local_40[0xe] = t.name.field_2._14_1_;
        local_40[0xf] = t.name.field_2._15_1_;
      }
      else {
        local_50._M_p = t.name._M_dataplus._M_p;
      }
      local_48 = t.name._M_string_length;
      t.name._M_string_length = 0;
      t.name.field_2._M_local_buf[0] = '\0';
      t.name._M_dataplus._M_p = (pointer)paVar1;
      std::
      _Rb_tree<Symbol,_Symbol,_std::_Identity<Symbol>,_std::less<Symbol>,_std::allocator<Symbol>_>::
      _M_insert_unique<Symbol>(&(this->symbols)._M_t,(Symbol *)local_58);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&t.name);
      bVar2 = true;
      goto LAB_0010c9af;
    }
    ch = ch + 1;
    it->_M_current = ch;
  } while( true );
}

Assistant:

bool lexical::analyse_annotation(string::iterator &it, const Meta &m) {
    int state = 0;
    string buf;
    while (it != m.end) {
        switch (state) {
            case 0: {
                state = 1;
                break;
            }
            case 1: {
                if (!sutil::is_key(*it, true)){
                    error(it, m, "注解的不能以非字母开头");
                    return false;
                }
                --it;
                state = 2;
                break;
            }
            case 2: {
                if (sutil::is_key(*it))buf.push_back(*it);
                else {
                    --it;
                    state = 3;
                }
                break;
            }
            case 3: {
                Token t(m.line, m.column, Token::ANNOTATION, buf);
                tokens.push_back(t);
                symbols.insert(Symbol(t.type, t.name));
                return true;
            }
        }
        ++it;
    }
    return false;
}